

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O1

int32_t trng::int_math::modulo_inverse(int32_t a,int32_t m)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  invalid_argument local_30 [16];
  
  if (a < 1 || m < 2) {
    std::invalid_argument::invalid_argument
              (local_30,"invalid argument in trng::int_math::modulo_inverse");
    utility::throw_this<std::invalid_argument>(local_30);
    std::invalid_argument::~invalid_argument(local_30);
  }
  iVar6 = 1;
  if (1 < a) {
    iVar4 = 0;
    uVar1 = (ulong)(uint)a;
    uVar3 = (ulong)(uint)m;
    do {
      uVar2 = uVar1;
      iVar5 = iVar6;
      iVar6 = (int)uVar2;
      uVar1 = (long)(int)uVar3 % (long)iVar6;
      iVar6 = iVar4 - ((int)uVar3 / iVar6) * iVar5;
      a = (int32_t)uVar1;
      iVar4 = iVar5;
      uVar3 = uVar2;
    } while (1 < a);
  }
  if (a == 0) {
    std::runtime_error::runtime_error
              ((runtime_error *)local_30,"no inverse in trng::int_math::modulo_inverse");
    utility::throw_this<std::runtime_error>((runtime_error *)local_30);
    std::runtime_error::~runtime_error((runtime_error *)local_30);
  }
  return (iVar6 >> 0x1f & m) + iVar6;
}

Assistant:

TRNG_CUDA_ENABLE
    inline int32_t modulo_inverse(int32_t a, int32_t m) {
#if !(defined TRNG_CUDA)
      if (a <= 0 or m <= 1)
        utility::throw_this(
            std::invalid_argument("invalid argument in trng::int_math::modulo_inverse"));
#endif
      int32_t flast{0}, f{1}, m1{m};
      while (a > 1) {
        int32_t temp{m1 % a};
        int32_t q{m1 / a};
        m1 = a;
        a = temp;
        temp = f;
        f = flast - q * f;
        flast = temp;
      }
#if !(defined TRNG_CUDA)
      if (a == 0)
        utility::throw_this(std::runtime_error("no inverse in trng::int_math::modulo_inverse"));
#endif
      return f >= 0 ? f : f + m;
    }